

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_size(Curl_easy *data)

{
  SingleRequest *pSVar1;
  SingleRequest *k;
  Curl_easy *data_local;
  
  pSVar1 = &data->req;
  if (((*(ushort *)&(data->req).field_0xbb >> 8 & 1) == 0) &&
     ((*(ushort *)&(data->req).field_0xbb >> 7 & 1) == 0)) {
    if (pSVar1->size != -1) {
      if (((data->set).max_filesize != 0) && ((data->set).max_filesize < pSVar1->size)) {
        Curl_failf(data,"Maximum file size exceeded");
        return CURLE_FILESIZE_EXCEEDED;
      }
      Curl_pgrsSetDownloadSize(data,pSVar1->size);
      (data->req).maxdownload = pSVar1->size;
    }
  }
  else {
    (data->req).maxdownload = -1;
    pSVar1->size = -1;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_size(struct Curl_easy *data)
{
  struct SingleRequest *k = &data->req;
  if(data->req.ignore_cl || k->chunk) {
    k->size = k->maxdownload = -1;
  }
  else if(k->size != -1) {
    if(data->set.max_filesize &&
       k->size > data->set.max_filesize) {
      failf(data, "Maximum file size exceeded");
      return CURLE_FILESIZE_EXCEEDED;
    }
    Curl_pgrsSetDownloadSize(data, k->size);
    k->maxdownload = k->size;
  }
  return CURLE_OK;
}